

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadresource.cpp
# Opt level: O0

load_gameboard_status_t *
Game::Loader::load_GameBoard_data_from_file
          (load_gameboard_status_t *__return_storage_ptr__,string *filename)

{
  bool bVar1;
  int iVar2;
  istream *buf;
  GameBoard local_348;
  bool local_305 [5];
  vector<Game::tile_t,_std::allocator<Game::tile_t>_> local_300;
  GameBoard local_2e8;
  bool local_2a1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a0;
  undefined1 local_288 [8];
  vector<Game::tile_t,_std::allocator<Game::tile_t>_> processed_tile_data;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  file_tile_data;
  ull savedBoardPlaySize;
  long local_220;
  ifstream stateFile;
  string *filename_local;
  
  std::ifstream::ifstream(&local_220,(string *)filename,_S_in);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)
               &file_tile_data.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)filename);
    iVar2 = anon_unknown_0::GetLines
                      ((string *)
                       &file_tile_data.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &file_tile_data.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    (anonymous_namespace)::get_file_tile_data_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&processed_tile_data.
                   super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,(_anonymous_namespace_ *)&local_220,buf
              );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_2a0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&processed_tile_data.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    anon_unknown_0::process_file_tile_string_data
              ((vector<Game::tile_t,_std::allocator<Game::tile_t>_> *)local_288,&local_2a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2a0);
    local_2a1 = true;
    std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>::vector
              (&local_300,(vector<Game::tile_t,_std::allocator<Game::tile_t>_> *)local_288);
    GameBoard::GameBoard(&local_2e8,(long)iVar2,&local_300);
    std::make_tuple<bool,Game::GameBoard>(__return_storage_ptr__,&local_2a1,&local_2e8);
    GameBoard::~GameBoard(&local_2e8);
    std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>::~vector(&local_300);
    local_305[1] = true;
    local_305[2] = false;
    local_305[3] = false;
    local_305[4] = false;
    std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>::~vector
              ((vector<Game::tile_t,_std::allocator<Game::tile_t>_> *)local_288);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&processed_tile_data.
                  super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  }
  else {
    local_305[0] = false;
    local_348.largestTile = 0;
    local_348.moveCount = 0;
    local_348.win = false;
    local_348.moved = false;
    local_348._34_6_ = 0;
    local_348.score = 0;
    local_348.gbda.
    super__Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
    .super__Tuple_impl<1UL,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>.
    super__Head_base<1UL,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>,_false>.
    _M_head_impl.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_348.gbda.
    super__Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
    .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
    local_348.gbda.
    super__Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
    .super__Tuple_impl<1UL,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>.
    super__Head_base<1UL,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>,_false>.
    _M_head_impl.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_348.gbda.
    super__Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
    .super__Tuple_impl<1UL,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>.
    super__Head_base<1UL,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>,_false>.
    _M_head_impl.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    GameBoard::GameBoard(&local_348);
    std::make_tuple<bool,Game::GameBoard>(__return_storage_ptr__,local_305,&local_348);
    GameBoard::~GameBoard(&local_348);
    local_305[1] = true;
    local_305[2] = false;
    local_305[3] = false;
    local_305[4] = false;
  }
  std::ifstream::~ifstream(&local_220);
  return __return_storage_ptr__;
}

Assistant:

load_gameboard_status_t load_GameBoard_data_from_file(std::string filename) {
  std::ifstream stateFile(filename);
  if (stateFile) {
    const ull savedBoardPlaySize = GetLines(filename);
    const auto file_tile_data = get_file_tile_data(stateFile);
    const auto processed_tile_data =
        process_file_tile_string_data(file_tile_data);
    return std::make_tuple(true,
                           GameBoard(savedBoardPlaySize, processed_tile_data));
  }
  return std::make_tuple(false, GameBoard{});
}